

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O1

void __thiscall
vkt::memory::anon_unknown_0::SubmitCommandBuffer::~SubmitCommandBuffer(SubmitCommandBuffer *this)

{
  ~SubmitCommandBuffer(this);
  operator_delete(this,0x40);
  return;
}

Assistant:

SubmitCommandBuffer::~SubmitCommandBuffer (void)
{
	for (size_t cmdNdx = 0; cmdNdx < m_commands.size(); cmdNdx++)
		delete m_commands[cmdNdx];
}